

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O1

CTcCodeLabel * __thiscall CTcCodeStream::new_label_here(CTcCodeStream *this)

{
  CTcCodeLabel *pCVar1;
  
  pCVar1 = alloc_label(this);
  pCVar1->ofs = (this->super_CTcDataStream).ofs_;
  pCVar1->field_0x18 = pCVar1->field_0x18 | 1;
  return pCVar1;
}

Assistant:

CTcCodeLabel *CTcCodeStream::new_label_here()
{
    CTcCodeLabel *lbl;
    
    /* allocate a new label */
    lbl = alloc_label();

    /* set the label's location to the current write position */
    lbl->ofs = ofs_;
    lbl->is_known = TRUE;

    /* return the new label */
    return lbl;
}